

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DifferenceFormatter>::
Ser<DataStream,std::vector<unsigned_short,std::allocator<unsigned_short>>>
          (VectorFormatter<DifferenceFormatter> *this,DataStream *s,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *v)

{
  bool bVar1;
  const_iterator cVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RSI;
  long in_FS_OFFSET;
  value_type_conflict4 *elem;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  DifferenceFormatter formatter;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffa8;
  DataStream *in_stack_ffffffffffffffb8;
  DataStream *in_stack_fffffffffffffff0;
  DifferenceFormatter *this_00;
  
  this_00 = *(DifferenceFormatter **)(in_FS_OFFSET + 0x28);
  DifferenceFormatter::DifferenceFormatter((DifferenceFormatter *)in_stack_ffffffffffffffa8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(in_stack_ffffffffffffffa8);
  WriteCompactSize<DataStream>(in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  cVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(in_RSI);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(in_RSI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_RSI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         (DataStream *)
         __gnu_cxx::
         __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
         ::operator*((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      *)in_stack_ffffffffffffffa8);
    DifferenceFormatter::Ser<DataStream,unsigned_short>
              (this_00,in_stack_fffffffffffffff0,(unsigned_short)((ulong)cVar2._M_current >> 0x30));
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_ffffffffffffffa8);
  }
  if (*(DifferenceFormatter **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }